

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_cache.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::stat_cache::set_cache_impl(stat_cache *this,file_index_t i,int64_t size)

{
  int64_t iVar1;
  bool bVar2;
  int iVar3;
  value_type *pvVar4;
  stat_cache_t local_30;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_24;
  int64_t local_20;
  int64_t size_local;
  stat_cache *this_local;
  file_index_t i_local;
  
  local_20 = size;
  size_local = (int64_t)this;
  this_local._4_4_ = i.m_val;
  local_24 = container_wrapper<libtorrent::aux::stat_cache::stat_cache_t,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>_>
             ::end_index(&this->m_stat_cache);
  bVar2 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator>=
                    ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                     ((long)&this_local + 4),&local_24);
  if (bVar2) {
    iVar3 = strong_typedef::operator_cast_to_int((strong_typedef *)((long)&this_local + 4));
    stat_cache_t::stat_cache_t(&local_30,-1);
    container_wrapper<libtorrent::aux::stat_cache::stat_cache_t,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::stat_cache::stat_cache_t,std::allocator<libtorrent::aux::stat_cache::stat_cache_t>>>
    ::resize<int,void>((container_wrapper<libtorrent::aux::stat_cache::stat_cache_t,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::stat_cache::stat_cache_t,std::allocator<libtorrent::aux::stat_cache::stat_cache_t>>>
                        *)&this->m_stat_cache,iVar3 + 1,&local_30);
  }
  iVar1 = local_20;
  pvVar4 = container_wrapper<libtorrent::aux::stat_cache::stat_cache_t,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>_>
           ::operator[](&this->m_stat_cache,
                        (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)this_local._4_4_
                       );
  pvVar4->file_size = iVar1;
  return;
}

Assistant:

void stat_cache::set_cache_impl(file_index_t const i, std::int64_t const size)
	{
		if (i >= m_stat_cache.end_index())
			m_stat_cache.resize(static_cast<int>(i) + 1, stat_cache_t{not_in_cache});
		m_stat_cache[i].file_size = size;
	}